

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.cc
# Opt level: O0

void __thiscall dynet::RNNStateMachine::failure(RNNStateMachine *this,RNNOp op)

{
  ostream *poVar1;
  invalid_argument *this_00;
  int in_ESI;
  int *in_RDI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"State transition error: currently in state ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDI);
  poVar1 = std::operator<<(poVar1," but received operation ");
  std::ostream::operator<<(poVar1,local_c);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RNNStateMachine::failure(RNNOp op) {
  ostringstream oss; oss << "State transition error: currently in state " << q_ << " but received operation " << op;
  throw std::invalid_argument(oss.str());
}